

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void inplace_fully_flip_container(roaring_array_t *x1_arr,uint16_t hb)

{
  int iVar1;
  container_t *pcVar2;
  container_t *container_to_flip;
  container_t *flipped_container;
  int32_t local_18;
  uint8_t ctype_out;
  uint8_t ctype_in;
  int i;
  uint16_t hb_local;
  roaring_array_t *x1_arr_local;
  
  _ctype_out = hb;
  _i = x1_arr;
  local_18 = ra_get_index(x1_arr,hb);
  if (local_18 < 0) {
    pcVar2 = container_range_of_ones(0,0x10000,(uint8_t *)((long)&flipped_container + 6));
    ra_insert_new_key_value_at(_i,-1 - local_18,_ctype_out,pcVar2,flipped_container._6_1_);
  }
  else {
    pcVar2 = ra_get_container_at_index
                       (_i,(uint16_t)local_18,(uint8_t *)((long)&flipped_container + 7));
    pcVar2 = container_inot(pcVar2,flipped_container._7_1_,(uint8_t *)((long)&flipped_container + 6)
                           );
    iVar1 = container_get_cardinality(pcVar2,flipped_container._6_1_);
    if (iVar1 == 0) {
      container_free(pcVar2,flipped_container._6_1_);
      ra_remove_at_index(_i,local_18);
    }
    else {
      ra_set_container_at_index(_i,local_18,pcVar2,flipped_container._6_1_);
    }
  }
  return;
}

Assistant:

static void inplace_fully_flip_container(roaring_array_t *x1_arr, uint16_t hb) {
    const int i = ra_get_index(x1_arr, hb);
    uint8_t ctype_in, ctype_out;
    container_t *flipped_container = NULL;
    if (i >= 0) {
        container_t *container_to_flip =
            ra_get_container_at_index(x1_arr, i, &ctype_in);
        flipped_container =
            container_inot(container_to_flip, ctype_in, &ctype_out);

        if (container_get_cardinality(flipped_container, ctype_out)) {
            ra_set_container_at_index(x1_arr, i, flipped_container, ctype_out);
        } else {
            container_free(flipped_container, ctype_out);
            ra_remove_at_index(x1_arr, i);
        }

    } else {
        flipped_container = container_range_of_ones(0U, 0x10000U, &ctype_out);
        ra_insert_new_key_value_at(x1_arr, -i - 1, hb, flipped_container,
                                   ctype_out);
    }
}